

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmbiVector.h
# Opt level: O3

void __thiscall
Eigen::internal::AmbiVector<double,_int>::Iterator::Iterator
          (Iterator *this,AmbiVector<double,_int> *vec,RealScalar *epsilon)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  Scalar_conflict *pSVar4;
  ulong uVar5;
  bool bVar6;
  
  this->m_vector = vec;
  dVar1 = *epsilon;
  this->m_epsilon = dVar1;
  bVar6 = vec->m_mode == 0;
  this->m_isDense = bVar6;
  if (bVar6) {
    this->m_currentEl = 0;
    this->m_cachedValue = 0.0;
    this->m_cachedIndex = vec->m_start + -1;
    operator++(this);
    return;
  }
  pSVar4 = vec->m_buffer;
  uVar3 = vec->m_llStart;
  this->m_currentEl = uVar3;
  while( true ) {
    if ((int)uVar3 < 0) {
      this->m_cachedValue = 0.0;
      this->m_cachedIndex = -1;
      return;
    }
    uVar5 = (ulong)uVar3;
    dVar2 = pSVar4[uVar5 * 2 + 1];
    if (dVar1 < ABS(dVar2)) break;
    uVar3 = *(uint *)(pSVar4 + uVar5 * 2);
    this->m_currentEl = uVar3;
  }
  this->m_cachedIndex = *(Index *)((long)pSVar4 + uVar5 * 0x10 + 4);
  this->m_cachedValue = dVar2;
  return;
}

Assistant:

Iterator(const AmbiVector& vec, const RealScalar& epsilon = 0)
      : m_vector(vec)
    {
      using std::abs;
      m_epsilon = epsilon;
      m_isDense = m_vector.m_mode==IsDense;
      if (m_isDense)
      {
        m_currentEl = 0;   // this is to avoid a compilation warning
        m_cachedValue = 0; // this is to avoid a compilation warning
        m_cachedIndex = m_vector.m_start-1;
        ++(*this);
      }
      else
      {
        ListEl* EIGEN_RESTRICT llElements = reinterpret_cast<ListEl*>(m_vector.m_buffer);
        m_currentEl = m_vector.m_llStart;
        while (m_currentEl>=0 && abs(llElements[m_currentEl].value)<=m_epsilon)
          m_currentEl = llElements[m_currentEl].next;
        if (m_currentEl<0)
        {
          m_cachedValue = 0; // this is to avoid a compilation warning
          m_cachedIndex = -1;
        }
        else
        {
          m_cachedIndex = llElements[m_currentEl].index;
          m_cachedValue = llElements[m_currentEl].value;
        }
      }
    }